

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_striped_avx2_256_8.c
# Opt level: O0

parasail_result_t *
parasail_sw_stats_rowcol_striped_profile_avx2_256_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  __m256i a;
  __m256i alVar26;
  __m256i alVar27;
  __m256i alVar28;
  __m256i alVar29;
  __m256i alVar30;
  __m256i alVar31;
  __m256i alVar32;
  __m256i c;
  __m256i vH_00;
  __m256i vH_01;
  __m256i vH_02;
  __m256i vH_03;
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  __m256i *palVar51;
  __m256i *palVar52;
  __m256i *palVar53;
  __m256i *palVar54;
  __m256i *palVar55;
  byte bVar56;
  int iVar57;
  __m256i *ptr;
  __m256i *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  long lVar58;
  uint in_ECX;
  int in_EDX;
  int iVar59;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [64];
  int32_t temp;
  int32_t column_len;
  int8_t *l;
  int8_t *s;
  int8_t *m;
  int8_t *t;
  __m256i *tmp_15;
  __m256i *tmp_14;
  __m256i *tmp_13;
  __m256i *tmp_12;
  __m256i *tmp_11;
  __m256i *tmp_10;
  __m256i *tmp_9;
  __m256i *tmp_8;
  __m256i vHL_1;
  __m256i vHS_1;
  __m256i vHM_1;
  __m256i vH_1;
  __m256i vCompare;
  __m256i cond;
  __m256i case2_1;
  __m256i case1_1;
  __m256i vHp;
  __m256i case2;
  __m256i case1;
  __m256i cond_zero;
  __m256i *tmp_7;
  __m256i *tmp_6;
  __m256i *tmp_5;
  __m256i *tmp_4;
  __m256i *tmp_3;
  __m256i *tmp_2;
  __m256i *tmp_1;
  __m256i *tmp;
  __m256i *vPS;
  __m256i *vPM;
  __m256i *vP;
  __m256i vHL;
  __m256i vHS;
  __m256i vHM;
  __m256i vH_dag;
  __m256i vH;
  __m256i vFL;
  __m256i vFS;
  __m256i vFM;
  __m256i vF_ext;
  __m256i vF;
  __m256i vEL;
  __m256i vES;
  __m256i vEM;
  __m256i vE_ext;
  __m256i vE;
  __m256i vEF_opn;
  parasail_result_t *result;
  int8_t maxp;
  __m256i vPosLimit;
  __m256i vSaturationCheckMax;
  __m256i insert_mask;
  __m256i vMaxHUnit;
  __m256i vMaxH;
  __m256i vBias1;
  __m256i vBias;
  int8_t length;
  int8_t similar;
  int8_t matches;
  int8_t score;
  int8_t bias;
  __m256i vOne;
  __m256i vZero;
  __m256i vGapE;
  __m256i vGapO;
  __m256i *pvHLMax;
  __m256i *pvHSMax;
  __m256i *pvHMMax;
  __m256i *pvHMax;
  __m256i *pvEL;
  __m256i *pvES;
  __m256i *pvEM;
  __m256i *pvE;
  __m256i *pvHLLoad;
  __m256i *pvHLStore;
  __m256i *pvHSLoad;
  __m256i *pvHSStore;
  __m256i *pvHMLoad;
  __m256i *pvHMStore;
  __m256i *pvHLoad;
  __m256i *pvHStore;
  __m256i *vProfileS;
  __m256i *vProfileM;
  __m256i *vProfile;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t s1Len;
  int32_t end_ref;
  int32_t end_query;
  int32_t k;
  int32_t j;
  int32_t i;
  undefined1 in_stack_ffffffffffffdb80 [12];
  int32_t in_stack_ffffffffffffdb8c;
  undefined2 in_stack_ffffffffffffdb90;
  byte in_stack_ffffffffffffdb92;
  undefined1 uVar64;
  undefined1 uVar65;
  undefined1 uVar66;
  undefined4 in_stack_ffffffffffffdb98;
  undefined4 in_stack_ffffffffffffdb9c;
  undefined8 in_stack_ffffffffffffdba0;
  __m256i *palVar67;
  undefined8 in_stack_ffffffffffffdba8;
  __m256i *palVar68;
  longlong in_stack_ffffffffffffdbb0;
  __m256i *palVar69;
  __m256i *local_2448;
  int *in_stack_ffffffffffffdbc0;
  __m256i *in_stack_ffffffffffffdbd0;
  long lStack_2368;
  __m256i local_2300;
  undefined1 local_2220 [32];
  undefined1 local_2200 [32];
  undefined1 local_21e0 [64];
  undefined1 local_21a0 [32];
  undefined1 local_2180 [32];
  undefined1 local_2160 [32];
  undefined1 local_2140 [32];
  undefined1 local_2100 [32];
  longlong local_20e0;
  longlong lStack_20d8;
  longlong lStack_20d0;
  longlong lStack_20c8;
  longlong local_20c0;
  longlong lStack_20b8;
  longlong lStack_20b0;
  longlong lStack_20a8;
  longlong local_20a0;
  longlong lStack_2098;
  longlong lStack_2090;
  longlong lStack_2088;
  longlong local_2060;
  longlong lStack_2058;
  longlong lStack_2050;
  longlong lStack_2048;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  undefined1 local_1fe0 [32];
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  undefined1 local_1f80 [32];
  char local_1f05;
  char local_1f04;
  char local_1f03;
  byte local_1f02;
  __m256i *local_1e78;
  __m256i *local_1e70;
  __m256i *local_1e68;
  __m256i *local_1e60;
  __m256i *local_1e38;
  __m256i *local_1e30;
  __m256i *local_1e28;
  __m256i *local_1e20;
  __m256i *local_1e18;
  __m256i *local_1e10;
  __m256i *local_1e08;
  __m256i *local_1e00;
  int local_1dc0;
  int local_1dbc;
  int local_1db8;
  int local_1db4;
  int local_1db0;
  byte local_1dac;
  byte local_1da8;
  parasail_result_t *local_1d90;
  ulong uStack_1d78;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  
  if (in_RDI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_stats_rowcol_striped_profile_avx2_256_8",
            "profile");
    local_1d90 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x18) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_stats_rowcol_striped_profile_avx2_256_8",
            "profile->profile8.score");
    local_1d90 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x10) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_stats_rowcol_striped_profile_avx2_256_8",
            "profile->matrix");
    local_1d90 = (parasail_result_t *)0x0;
  }
  else if (*(int *)(in_RDI + 8) < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_stats_rowcol_striped_profile_avx2_256_8",
            "profile->s1Len");
    local_1d90 = (parasail_result_t *)0x0;
  }
  else if (in_RSI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_stats_rowcol_striped_profile_avx2_256_8","s2");
    local_1d90 = (parasail_result_t *)0x0;
  }
  else if (in_EDX < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_stats_rowcol_striped_profile_avx2_256_8",
            "s2Len");
    local_1d90 = (parasail_result_t *)0x0;
  }
  else if ((int)in_ECX < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_stats_rowcol_striped_profile_avx2_256_8",
            "open");
    local_1d90 = (parasail_result_t *)0x0;
  }
  else if ((int)in_R8D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_stats_rowcol_striped_profile_avx2_256_8",
            "gap");
    local_1d90 = (parasail_result_t *)0x0;
  }
  else {
    local_1dc0 = 0;
    local_1dbc = *(int *)(in_RDI + 8);
    lVar4 = *(long *)(in_RDI + 0x10);
    iVar57 = (local_1dbc + 0x1f) / 0x20;
    iVar59 = (local_1dbc + -1) % iVar57;
    lVar5 = *(long *)(in_RDI + 0x18);
    lVar6 = *(long *)(in_RDI + 0x20);
    lVar7 = *(long *)(in_RDI + 0x28);
    local_1da8 = (byte)in_ECX;
    auVar8 = vpinsrb_avx(ZEXT116(local_1da8),in_ECX & 0xff,1);
    auVar8 = vpinsrb_avx(auVar8,in_ECX & 0xff,2);
    auVar8 = vpinsrb_avx(auVar8,in_ECX & 0xff,3);
    auVar8 = vpinsrb_avx(auVar8,in_ECX & 0xff,4);
    auVar8 = vpinsrb_avx(auVar8,in_ECX & 0xff,5);
    auVar8 = vpinsrb_avx(auVar8,in_ECX & 0xff,6);
    auVar8 = vpinsrb_avx(auVar8,in_ECX & 0xff,7);
    auVar8 = vpinsrb_avx(auVar8,in_ECX & 0xff,8);
    auVar8 = vpinsrb_avx(auVar8,in_ECX & 0xff,9);
    auVar8 = vpinsrb_avx(auVar8,in_ECX & 0xff,10);
    auVar8 = vpinsrb_avx(auVar8,in_ECX & 0xff,0xb);
    auVar8 = vpinsrb_avx(auVar8,in_ECX & 0xff,0xc);
    auVar8 = vpinsrb_avx(auVar8,in_ECX & 0xff,0xd);
    auVar8 = vpinsrb_avx(auVar8,in_ECX & 0xff,0xe);
    auVar8 = vpinsrb_avx(auVar8,in_ECX & 0xff,0xf);
    auVar9 = vpinsrb_avx(ZEXT116(local_1da8),in_ECX & 0xff,1);
    auVar9 = vpinsrb_avx(auVar9,in_ECX & 0xff,2);
    auVar9 = vpinsrb_avx(auVar9,in_ECX & 0xff,3);
    auVar9 = vpinsrb_avx(auVar9,in_ECX & 0xff,4);
    auVar9 = vpinsrb_avx(auVar9,in_ECX & 0xff,5);
    auVar9 = vpinsrb_avx(auVar9,in_ECX & 0xff,6);
    auVar9 = vpinsrb_avx(auVar9,in_ECX & 0xff,7);
    auVar9 = vpinsrb_avx(auVar9,in_ECX & 0xff,8);
    auVar9 = vpinsrb_avx(auVar9,in_ECX & 0xff,9);
    auVar9 = vpinsrb_avx(auVar9,in_ECX & 0xff,10);
    auVar9 = vpinsrb_avx(auVar9,in_ECX & 0xff,0xb);
    auVar9 = vpinsrb_avx(auVar9,in_ECX & 0xff,0xc);
    auVar9 = vpinsrb_avx(auVar9,in_ECX & 0xff,0xd);
    auVar9 = vpinsrb_avx(auVar9,in_ECX & 0xff,0xe);
    auVar9 = vpinsrb_avx(auVar9,in_ECX & 0xff,0xf);
    uStack_1890 = auVar9._0_8_;
    uStack_1888 = auVar9._8_8_;
    local_1dac = (byte)in_R8D;
    auVar9 = vpinsrb_avx(ZEXT116(local_1dac),in_R8D & 0xff,1);
    auVar9 = vpinsrb_avx(auVar9,in_R8D & 0xff,2);
    auVar9 = vpinsrb_avx(auVar9,in_R8D & 0xff,3);
    auVar9 = vpinsrb_avx(auVar9,in_R8D & 0xff,4);
    auVar9 = vpinsrb_avx(auVar9,in_R8D & 0xff,5);
    auVar9 = vpinsrb_avx(auVar9,in_R8D & 0xff,6);
    auVar9 = vpinsrb_avx(auVar9,in_R8D & 0xff,7);
    auVar9 = vpinsrb_avx(auVar9,in_R8D & 0xff,8);
    auVar9 = vpinsrb_avx(auVar9,in_R8D & 0xff,9);
    auVar9 = vpinsrb_avx(auVar9,in_R8D & 0xff,10);
    auVar9 = vpinsrb_avx(auVar9,in_R8D & 0xff,0xb);
    auVar9 = vpinsrb_avx(auVar9,in_R8D & 0xff,0xc);
    auVar9 = vpinsrb_avx(auVar9,in_R8D & 0xff,0xd);
    auVar9 = vpinsrb_avx(auVar9,in_R8D & 0xff,0xe);
    auVar9 = vpinsrb_avx(auVar9,in_R8D & 0xff,0xf);
    auVar10 = vpinsrb_avx(ZEXT116(local_1dac),in_R8D & 0xff,1);
    auVar10 = vpinsrb_avx(auVar10,in_R8D & 0xff,2);
    auVar10 = vpinsrb_avx(auVar10,in_R8D & 0xff,3);
    auVar10 = vpinsrb_avx(auVar10,in_R8D & 0xff,4);
    auVar10 = vpinsrb_avx(auVar10,in_R8D & 0xff,5);
    auVar10 = vpinsrb_avx(auVar10,in_R8D & 0xff,6);
    auVar10 = vpinsrb_avx(auVar10,in_R8D & 0xff,7);
    auVar10 = vpinsrb_avx(auVar10,in_R8D & 0xff,8);
    auVar10 = vpinsrb_avx(auVar10,in_R8D & 0xff,9);
    auVar10 = vpinsrb_avx(auVar10,in_R8D & 0xff,10);
    auVar10 = vpinsrb_avx(auVar10,in_R8D & 0xff,0xb);
    auVar10 = vpinsrb_avx(auVar10,in_R8D & 0xff,0xc);
    auVar10 = vpinsrb_avx(auVar10,in_R8D & 0xff,0xd);
    auVar10 = vpinsrb_avx(auVar10,in_R8D & 0xff,0xe);
    auVar10 = vpinsrb_avx(auVar10,in_R8D & 0xff,0xf);
    uStack_1850 = auVar10._0_8_;
    uStack_1848 = auVar10._8_8_;
    uStack_1d78 = SUB328(ZEXT832(0),4);
    uVar64 = 1;
    auVar10 = vpinsrb_avx(ZEXT116(1),1,1);
    auVar10 = vpinsrb_avx(auVar10,1,2);
    auVar10 = vpinsrb_avx(auVar10,1,3);
    auVar10 = vpinsrb_avx(auVar10,1,4);
    auVar10 = vpinsrb_avx(auVar10,1,5);
    auVar10 = vpinsrb_avx(auVar10,1,6);
    auVar10 = vpinsrb_avx(auVar10,1,7);
    auVar10 = vpinsrb_avx(auVar10,1,8);
    auVar10 = vpinsrb_avx(auVar10,1,9);
    auVar10 = vpinsrb_avx(auVar10,1,10);
    auVar10 = vpinsrb_avx(auVar10,1,0xb);
    auVar10 = vpinsrb_avx(auVar10,1,0xc);
    auVar10 = vpinsrb_avx(auVar10,1,0xd);
    auVar10 = vpinsrb_avx(auVar10,1,0xe);
    auVar10 = vpinsrb_avx(auVar10,1,0xf);
    auVar11 = vpinsrb_avx(ZEXT116(1),1,1);
    auVar11 = vpinsrb_avx(auVar11,1,2);
    auVar11 = vpinsrb_avx(auVar11,1,3);
    auVar11 = vpinsrb_avx(auVar11,1,4);
    auVar11 = vpinsrb_avx(auVar11,1,5);
    auVar11 = vpinsrb_avx(auVar11,1,6);
    auVar11 = vpinsrb_avx(auVar11,1,7);
    auVar11 = vpinsrb_avx(auVar11,1,8);
    auVar11 = vpinsrb_avx(auVar11,1,9);
    auVar11 = vpinsrb_avx(auVar11,1,10);
    auVar11 = vpinsrb_avx(auVar11,1,0xb);
    auVar11 = vpinsrb_avx(auVar11,1,0xc);
    auVar11 = vpinsrb_avx(auVar11,1,0xd);
    auVar11 = vpinsrb_avx(auVar11,1,0xe);
    auVar11 = vpinsrb_avx(auVar11,1,0xf);
    uStack_1810 = auVar11._0_8_;
    uStack_1808 = auVar11._8_8_;
    local_1f02 = 0x80;
    local_1f03 = -0x80;
    local_1f04 = -0x80;
    local_1f05 = -0x80;
    uVar65 = 0x80;
    auVar11 = vpinsrb_avx(ZEXT116(0x80),0x80,1);
    auVar11 = vpinsrb_avx(auVar11,0x80,2);
    auVar11 = vpinsrb_avx(auVar11,0x80,3);
    auVar11 = vpinsrb_avx(auVar11,0x80,4);
    auVar11 = vpinsrb_avx(auVar11,0x80,5);
    auVar11 = vpinsrb_avx(auVar11,0x80,6);
    auVar11 = vpinsrb_avx(auVar11,0x80,7);
    auVar11 = vpinsrb_avx(auVar11,0x80,8);
    auVar11 = vpinsrb_avx(auVar11,0x80,9);
    auVar11 = vpinsrb_avx(auVar11,0x80,10);
    auVar11 = vpinsrb_avx(auVar11,0x80,0xb);
    auVar11 = vpinsrb_avx(auVar11,0x80,0xc);
    auVar11 = vpinsrb_avx(auVar11,0x80,0xd);
    auVar11 = vpinsrb_avx(auVar11,0x80,0xe);
    auVar11 = vpinsrb_avx(auVar11,0x80,0xf);
    auVar62 = vpinsrb_avx(ZEXT116(0x80),0x80,1);
    auVar62 = vpinsrb_avx(auVar62,0x80,2);
    auVar62 = vpinsrb_avx(auVar62,0x80,3);
    auVar62 = vpinsrb_avx(auVar62,0x80,4);
    auVar62 = vpinsrb_avx(auVar62,0x80,5);
    auVar62 = vpinsrb_avx(auVar62,0x80,6);
    auVar62 = vpinsrb_avx(auVar62,0x80,7);
    auVar62 = vpinsrb_avx(auVar62,0x80,8);
    auVar62 = vpinsrb_avx(auVar62,0x80,9);
    auVar62 = vpinsrb_avx(auVar62,0x80,10);
    auVar62 = vpinsrb_avx(auVar62,0x80,0xb);
    auVar62 = vpinsrb_avx(auVar62,0x80,0xc);
    auVar62 = vpinsrb_avx(auVar62,0x80,0xd);
    auVar62 = vpinsrb_avx(auVar62,0x80,0xe);
    auVar62 = vpinsrb_avx(auVar62,0x80,0xf);
    uStack_17d0 = auVar62._0_8_;
    uStack_17c8 = auVar62._8_8_;
    auVar19._16_8_ = uStack_17d0;
    auVar19._0_16_ = auVar11;
    auVar19._24_8_ = uStack_17c8;
    auVar14._16_8_ = uStack_1810;
    auVar14._0_16_ = auVar10;
    auVar14._24_8_ = uStack_1808;
    auVar14 = vpaddsb_avx2(auVar19,auVar14);
    local_1f80._16_8_ = uStack_17d0;
    local_1f80._0_16_ = auVar11;
    local_1f80._24_8_ = uStack_17c8;
    auVar12 = vpinsrb_avx(ZEXT116(1),0,1);
    auVar12 = vpinsrb_avx(auVar12,0,2);
    auVar12 = vpinsrb_avx(auVar12,0,3);
    auVar12 = vpinsrb_avx(auVar12,0,4);
    auVar12 = vpinsrb_avx(auVar12,0,5);
    auVar12 = vpinsrb_avx(auVar12,0,6);
    auVar12 = vpinsrb_avx(auVar12,0,7);
    auVar12 = vpinsrb_avx(auVar12,0,8);
    auVar12 = vpinsrb_avx(auVar12,0,9);
    auVar12 = vpinsrb_avx(auVar12,0,10);
    auVar12 = vpinsrb_avx(auVar12,0,0xb);
    auVar12 = vpinsrb_avx(auVar12,0,0xc);
    auVar12 = vpinsrb_avx(auVar12,0,0xd);
    auVar12 = vpinsrb_avx(auVar12,0,0xe);
    auVar12 = vpinsrb_avx(auVar12,0,0xf);
    auVar13 = vpinsrb_avx(ZEXT116(0),0,1);
    auVar13 = vpinsrb_avx(auVar13,0,2);
    auVar13 = vpinsrb_avx(auVar13,0,3);
    auVar13 = vpinsrb_avx(auVar13,0,4);
    auVar13 = vpinsrb_avx(auVar13,0,5);
    auVar13 = vpinsrb_avx(auVar13,0,6);
    auVar13 = vpinsrb_avx(auVar13,0,7);
    auVar13 = vpinsrb_avx(auVar13,0,8);
    auVar13 = vpinsrb_avx(auVar13,0,9);
    auVar13 = vpinsrb_avx(auVar13,0,10);
    auVar13 = vpinsrb_avx(auVar13,0,0xb);
    auVar13 = vpinsrb_avx(auVar13,0,0xc);
    auVar13 = vpinsrb_avx(auVar13,0,0xd);
    auVar13 = vpinsrb_avx(auVar13,0,0xe);
    auVar13 = vpinsrb_avx(auVar13,0,0xf);
    uStack_1710 = auVar13._0_8_;
    uStack_1708 = auVar13._8_8_;
    auVar15._16_8_ = uStack_1710;
    auVar15._0_16_ = auVar12;
    auVar15._24_8_ = uStack_1708;
    auVar19 = vpcmpgtb_avx2(auVar15,ZEXT832(uStack_1d78) << 0x40);
    local_1fe0._16_8_ = uStack_17d0;
    local_1fe0._0_16_ = auVar11;
    local_1fe0._24_8_ = uStack_17c8;
    uVar66 = 0x7f;
    auVar12 = vpinsrb_avx(ZEXT116(0x7f),0x7f,1);
    auVar12 = vpinsrb_avx(auVar12,0x7f,2);
    auVar12 = vpinsrb_avx(auVar12,0x7f,3);
    auVar12 = vpinsrb_avx(auVar12,0x7f,4);
    auVar12 = vpinsrb_avx(auVar12,0x7f,5);
    auVar12 = vpinsrb_avx(auVar12,0x7f,6);
    auVar12 = vpinsrb_avx(auVar12,0x7f,7);
    auVar12 = vpinsrb_avx(auVar12,0x7f,8);
    auVar12 = vpinsrb_avx(auVar12,0x7f,9);
    auVar12 = vpinsrb_avx(auVar12,0x7f,10);
    auVar12 = vpinsrb_avx(auVar12,0x7f,0xb);
    auVar12 = vpinsrb_avx(auVar12,0x7f,0xc);
    auVar12 = vpinsrb_avx(auVar12,0x7f,0xd);
    auVar12 = vpinsrb_avx(auVar12,0x7f,0xe);
    auVar12 = vpinsrb_avx(auVar12,0x7f,0xf);
    auVar13 = vpinsrb_avx(ZEXT116(0x7f),0x7f,1);
    auVar13 = vpinsrb_avx(auVar13,0x7f,2);
    auVar13 = vpinsrb_avx(auVar13,0x7f,3);
    auVar13 = vpinsrb_avx(auVar13,0x7f,4);
    auVar13 = vpinsrb_avx(auVar13,0x7f,5);
    auVar13 = vpinsrb_avx(auVar13,0x7f,6);
    auVar13 = vpinsrb_avx(auVar13,0x7f,7);
    auVar13 = vpinsrb_avx(auVar13,0x7f,8);
    auVar13 = vpinsrb_avx(auVar13,0x7f,9);
    auVar13 = vpinsrb_avx(auVar13,0x7f,10);
    auVar13 = vpinsrb_avx(auVar13,0x7f,0xb);
    auVar13 = vpinsrb_avx(auVar13,0x7f,0xc);
    auVar13 = vpinsrb_avx(auVar13,0x7f,0xd);
    auVar13 = vpinsrb_avx(auVar13,0x7f,0xe);
    auVar13 = vpinsrb_avx(auVar13,0x7f,0xf);
    auVar61 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar12;
    uVar1 = *(undefined4 *)(lVar4 + 0x1c);
    auVar63 = ZEXT1664(auVar12);
    local_1d90 = parasail_result_new_rowcol3(iVar57 * 0x20,in_EDX);
    if (local_1d90 == (parasail_result_t *)0x0) {
      local_1d90 = (parasail_result_t *)0x0;
    }
    else {
      local_1d90->flag = local_1d90->flag | 0x20110804;
      local_1d90->flag = local_1d90->flag | 0x40000;
      local_1e00 = parasail_memalign___m256i(0x20,(long)iVar57);
      local_1e08 = parasail_memalign___m256i(0x20,(long)iVar57);
      local_1e10 = parasail_memalign___m256i(0x20,(long)iVar57);
      local_1e18 = parasail_memalign___m256i(0x20,(long)iVar57);
      local_1e20 = parasail_memalign___m256i(0x20,(long)iVar57);
      local_1e28 = parasail_memalign___m256i(0x20,(long)iVar57);
      local_1e30 = parasail_memalign___m256i(0x20,(long)iVar57);
      local_1e38 = parasail_memalign___m256i(0x20,(long)iVar57);
      ptr = parasail_memalign___m256i(0x20,(long)iVar57);
      ptr_00 = parasail_memalign___m256i(0x20,(long)iVar57);
      ptr_01 = parasail_memalign___m256i(0x20,(long)iVar57);
      ptr_02 = parasail_memalign___m256i(0x20,(long)iVar57);
      local_1e60 = parasail_memalign___m256i(0x20,(long)iVar57);
      local_1e68 = parasail_memalign___m256i(0x20,(long)iVar57);
      local_1e70 = parasail_memalign___m256i(0x20,(long)iVar57);
      local_1e78 = parasail_memalign___m256i(0x20,(long)iVar57);
      if (local_1e00 == (__m256i *)0x0) {
        local_1d90 = (parasail_result_t *)0x0;
      }
      else if (local_1e08 == (__m256i *)0x0) {
        local_1d90 = (parasail_result_t *)0x0;
      }
      else if (local_1e10 == (__m256i *)0x0) {
        local_1d90 = (parasail_result_t *)0x0;
      }
      else if (local_1e18 == (__m256i *)0x0) {
        local_1d90 = (parasail_result_t *)0x0;
      }
      else if (local_1e20 == (__m256i *)0x0) {
        local_1d90 = (parasail_result_t *)0x0;
      }
      else if (local_1e28 == (__m256i *)0x0) {
        local_1d90 = (parasail_result_t *)0x0;
      }
      else if (local_1e30 == (__m256i *)0x0) {
        local_1d90 = (parasail_result_t *)0x0;
      }
      else if (local_1e38 == (__m256i *)0x0) {
        local_1d90 = (parasail_result_t *)0x0;
      }
      else if (ptr == (__m256i *)0x0) {
        local_1d90 = (parasail_result_t *)0x0;
      }
      else if (ptr_00 == (__m256i *)0x0) {
        local_1d90 = (parasail_result_t *)0x0;
      }
      else if (ptr_01 == (__m256i *)0x0) {
        local_1d90 = (parasail_result_t *)0x0;
      }
      else if (ptr_02 == (__m256i *)0x0) {
        local_1d90 = (parasail_result_t *)0x0;
      }
      else if (local_1e60 == (__m256i *)0x0) {
        local_1d90 = (parasail_result_t *)0x0;
      }
      else if (local_1e68 == (__m256i *)0x0) {
        local_1d90 = (parasail_result_t *)0x0;
      }
      else if (local_1e70 == (__m256i *)0x0) {
        local_1d90 = (parasail_result_t *)0x0;
      }
      else if (local_1e78 == (__m256i *)0x0) {
        local_1d90 = (parasail_result_t *)0x0;
      }
      else {
        alVar26[0]._4_4_ = in_stack_ffffffffffffdb9c;
        alVar26[0]._0_4_ = in_stack_ffffffffffffdb98;
        alVar26[1] = in_stack_ffffffffffffdba0;
        alVar26[2] = in_stack_ffffffffffffdba8;
        alVar26[3] = in_stack_ffffffffffffdbb0;
        parasail_memset___m256i
                  (in_stack_ffffffffffffdbd0,alVar26,
                   CONCAT17(uVar66,CONCAT16(uVar65,CONCAT15(uVar64,CONCAT14(local_1dac,
                                                                            CONCAT13(local_1da8,
                                                                                     CONCAT12(
                                                  in_stack_ffffffffffffdb92,
                                                  in_stack_ffffffffffffdb90)))))));
        alVar27[0]._4_4_ = in_stack_ffffffffffffdb9c;
        alVar27[0]._0_4_ = in_stack_ffffffffffffdb98;
        alVar27[1] = in_stack_ffffffffffffdba0;
        alVar27[2] = in_stack_ffffffffffffdba8;
        alVar27[3] = in_stack_ffffffffffffdbb0;
        parasail_memset___m256i
                  (in_stack_ffffffffffffdbd0,alVar27,
                   CONCAT17(uVar66,CONCAT16(uVar65,CONCAT15(uVar64,CONCAT14(local_1dac,
                                                                            CONCAT13(local_1da8,
                                                                                     CONCAT12(
                                                  in_stack_ffffffffffffdb92,
                                                  in_stack_ffffffffffffdb90)))))));
        alVar28[0]._4_4_ = in_stack_ffffffffffffdb9c;
        alVar28[0]._0_4_ = in_stack_ffffffffffffdb98;
        alVar28[1] = in_stack_ffffffffffffdba0;
        alVar28[2] = in_stack_ffffffffffffdba8;
        alVar28[3] = in_stack_ffffffffffffdbb0;
        parasail_memset___m256i
                  (in_stack_ffffffffffffdbd0,alVar28,
                   CONCAT17(uVar66,CONCAT16(uVar65,CONCAT15(uVar64,CONCAT14(local_1dac,
                                                                            CONCAT13(local_1da8,
                                                                                     CONCAT12(
                                                  in_stack_ffffffffffffdb92,
                                                  in_stack_ffffffffffffdb90)))))));
        alVar29[0]._4_4_ = in_stack_ffffffffffffdb9c;
        alVar29[0]._0_4_ = in_stack_ffffffffffffdb98;
        alVar29[1] = in_stack_ffffffffffffdba0;
        alVar29[2] = in_stack_ffffffffffffdba8;
        alVar29[3] = in_stack_ffffffffffffdbb0;
        parasail_memset___m256i
                  (in_stack_ffffffffffffdbd0,alVar29,
                   CONCAT17(uVar66,CONCAT16(uVar65,CONCAT15(uVar64,CONCAT14(local_1dac,
                                                                            CONCAT13(local_1da8,
                                                                                     CONCAT12(
                                                  in_stack_ffffffffffffdb92,
                                                  in_stack_ffffffffffffdb90)))))));
        alVar30[0]._4_4_ = in_stack_ffffffffffffdb9c;
        alVar30[0]._0_4_ = in_stack_ffffffffffffdb98;
        alVar30[1] = in_stack_ffffffffffffdba0;
        alVar30[2] = in_stack_ffffffffffffdba8;
        alVar30[3] = in_stack_ffffffffffffdbb0;
        parasail_memset___m256i
                  (in_stack_ffffffffffffdbd0,alVar30,
                   CONCAT17(uVar66,CONCAT16(uVar65,CONCAT15(uVar64,CONCAT14(local_1dac,
                                                                            CONCAT13(local_1da8,
                                                                                     CONCAT12(
                                                  in_stack_ffffffffffffdb92,
                                                  in_stack_ffffffffffffdb90)))))));
        alVar31[0]._4_4_ = in_stack_ffffffffffffdb9c;
        alVar31[0]._0_4_ = in_stack_ffffffffffffdb98;
        alVar31[1] = in_stack_ffffffffffffdba0;
        alVar31[2] = in_stack_ffffffffffffdba8;
        alVar31[3] = in_stack_ffffffffffffdbb0;
        parasail_memset___m256i
                  (in_stack_ffffffffffffdbd0,alVar31,
                   CONCAT17(uVar66,CONCAT16(uVar65,CONCAT15(uVar64,CONCAT14(local_1dac,
                                                                            CONCAT13(local_1da8,
                                                                                     CONCAT12(
                                                  in_stack_ffffffffffffdb92,
                                                  in_stack_ffffffffffffdb90)))))));
        alVar32[0]._4_4_ = in_stack_ffffffffffffdb9c;
        alVar32[0]._0_4_ = in_stack_ffffffffffffdb98;
        alVar32[1] = in_stack_ffffffffffffdba0;
        alVar32[2] = in_stack_ffffffffffffdba8;
        alVar32[3] = in_stack_ffffffffffffdbb0;
        parasail_memset___m256i
                  (in_stack_ffffffffffffdbd0,alVar32,
                   CONCAT17(uVar66,CONCAT16(uVar65,CONCAT15(uVar64,CONCAT14(local_1dac,
                                                                            CONCAT13(local_1da8,
                                                                                     CONCAT12(
                                                  in_stack_ffffffffffffdb92,
                                                  in_stack_ffffffffffffdb90)))))));
        c[0]._4_4_ = in_stack_ffffffffffffdb9c;
        c[0]._0_4_ = in_stack_ffffffffffffdb98;
        c[1] = in_stack_ffffffffffffdba0;
        c[2] = in_stack_ffffffffffffdba8;
        c[3] = in_stack_ffffffffffffdbb0;
        parasail_memset___m256i
                  (in_stack_ffffffffffffdbd0,c,
                   CONCAT17(uVar66,CONCAT16(uVar65,CONCAT15(uVar64,CONCAT14(local_1dac,
                                                                            CONCAT13(local_1da8,
                                                                                     CONCAT12(
                                                  in_stack_ffffffffffffdb92,
                                                  in_stack_ffffffffffffdb90)))))));
        local_1db4 = 0;
        auVar60 = auVar11;
        while( true ) {
          palVar55 = local_1e00;
          palVar54 = local_1e10;
          palVar53 = local_1e20;
          palVar52 = local_1e30;
          palVar51 = local_1e60;
          palVar69 = local_1e68;
          palVar68 = local_1e70;
          palVar67 = local_1e78;
          uStack_1f88 = auVar62._8_8_;
          uStack_1f90 = auVar62._0_8_;
          if (in_EDX <= local_1db4) break;
          local_2100._16_8_ = uStack_17d0;
          local_2100._0_16_ = auVar11;
          local_2100._24_8_ = uStack_17c8;
          local_2140._16_8_ = uStack_17d0;
          local_2140._0_16_ = auVar11;
          local_2140._24_8_ = uStack_17c8;
          local_2160._16_8_ = uStack_17d0;
          local_2160._0_16_ = auVar11;
          local_2160._24_8_ = uStack_17c8;
          auVar23 = vperm2i128_avx2(auVar63._0_32_,(undefined1  [32])local_1e00[iVar57 + -1],0x28);
          auVar15 = vpalignr_avx2((undefined1  [32])local_1e00[iVar57 + -1],auVar23,0xf);
          auVar24 = vperm2i128_avx2(auVar23,(undefined1  [32])local_1e10[iVar57 + -1],0x28);
          auVar23 = vpalignr_avx2((undefined1  [32])local_1e10[iVar57 + -1],auVar24,0xf);
          auVar25 = vperm2i128_avx2(auVar24,(undefined1  [32])local_1e20[iVar57 + -1],0x28);
          auVar24 = vpalignr_avx2((undefined1  [32])local_1e20[iVar57 + -1],auVar25,0xf);
          auVar25 = vperm2i128_avx2(auVar25,(undefined1  [32])local_1e30[iVar57 + -1],0x28);
          auVar25 = vpalignr_avx2((undefined1  [32])local_1e30[iVar57 + -1],auVar25,0xf);
          auVar18._16_8_ = uStack_17d0;
          auVar18._0_16_ = auVar11;
          auVar18._24_8_ = uStack_17c8;
          local_21a0 = vpblendvb_avx2(auVar15,auVar18,auVar19);
          auVar17._16_8_ = uStack_17d0;
          auVar17._0_16_ = auVar11;
          auVar17._24_8_ = uStack_17c8;
          local_21e0._0_32_ = vpblendvb_avx2(auVar23,auVar17,auVar19);
          auVar16._16_8_ = uStack_17d0;
          auVar16._0_16_ = auVar11;
          auVar16._24_8_ = uStack_17c8;
          local_2200 = vpblendvb_avx2(auVar24,auVar16,auVar19);
          auVar23._16_8_ = uStack_17d0;
          auVar23._0_16_ = auVar11;
          auVar23._24_8_ = uStack_17c8;
          local_2220 = vpblendvb_avx2(auVar25,auVar23,auVar19);
          lVar58 = lVar5 + (long)(*(int *)(*(long *)(lVar4 + 0x10) +
                                          (ulong)*(byte *)(in_RSI + local_1db4) * 4) * iVar57) *
                           0x20;
          iVar2 = *(int *)(*(long *)(lVar4 + 0x10) + (ulong)*(byte *)(in_RSI + local_1db4) * 4);
          iVar3 = *(int *)(*(long *)(lVar4 + 0x10) + (ulong)*(byte *)(in_RSI + local_1db4) * 4);
          if (local_1dc0 == local_1db4 + -2) {
            local_1e60 = local_1e08;
            local_1e00 = palVar51;
            local_1e68 = local_1e18;
            local_1e10 = palVar69;
            local_1e70 = local_1e28;
            local_1e20 = palVar68;
            local_1e78 = local_1e38;
            local_1e30 = palVar67;
          }
          else {
            local_1e00 = local_1e08;
            local_1e10 = local_1e18;
            local_1e20 = local_1e28;
            local_1e30 = local_1e38;
          }
          local_1e08 = palVar55;
          local_1e18 = palVar54;
          local_1e28 = palVar53;
          local_1e38 = palVar52;
          local_2180 = auVar14;
          for (local_1db0 = 0; local_1db0 < iVar57; local_1db0 = local_1db0 + 1) {
            alVar26 = ptr[local_1db0];
            alVar30 = ptr_00[local_1db0];
            alVar27 = ptr_00[local_1db0];
            alVar31 = ptr_01[local_1db0];
            alVar28 = ptr_01[local_1db0];
            alVar32 = ptr_02[local_1db0];
            alVar29 = ptr_02[local_1db0];
            auVar15 = vpaddsb_avx2(local_21a0,
                                   *(undefined1 (*) [32])(lVar58 + (long)local_1db0 * 0x20));
            auVar23 = vpmaxsb_avx2(auVar15,(undefined1  [32])ptr[local_1db0]);
            auVar20 = vpmaxsb_avx2(auVar23,local_2100);
            palVar67 = local_1e00 + local_1db0;
            local_21a0._0_8_ = auVar20._0_8_;
            local_21a0._8_8_ = auVar20._8_8_;
            local_21a0._16_8_ = auVar20._16_8_;
            local_21a0._24_8_ = auVar20._24_8_;
            (*palVar67)[0] = local_21a0._0_8_;
            (*palVar67)[1] = local_21a0._8_8_;
            (*palVar67)[2] = local_21a0._16_8_;
            (*palVar67)[3] = local_21a0._24_8_;
            auVar46._16_8_ = uStack_17d0;
            auVar46._0_16_ = auVar11;
            auVar46._24_8_ = uStack_17c8;
            auVar16 = vpcmpeqb_avx2(auVar20,auVar46);
            auVar17 = vpcmpeqb_avx2(auVar20,auVar15);
            auVar18 = vpcmpeqb_avx2(auVar20,local_2100);
            auVar23 = vpblendvb_avx2((undefined1  [32])alVar30,local_2140,auVar18);
            auVar15 = vpaddsb_avx2(local_21e0._0_32_,
                                   *(undefined1 (*) [32])
                                    (lVar6 + (long)(iVar2 * iVar57) * 0x20 + (long)local_1db0 * 0x20
                                    ));
            auVar15 = vpblendvb_avx2(auVar23,auVar15,auVar17);
            auVar44._16_8_ = uStack_17d0;
            auVar44._0_16_ = auVar11;
            auVar44._24_8_ = uStack_17c8;
            auVar24 = vpblendvb_avx2(auVar15,auVar44,auVar16);
            palVar67 = local_1e10 + local_1db0;
            local_21e0._0_8_ = auVar24._0_8_;
            local_21e0._8_8_ = auVar24._8_8_;
            local_21e0._16_8_ = auVar24._16_8_;
            local_21e0._24_8_ = auVar24._24_8_;
            (*palVar67)[0] = local_21e0._0_8_;
            (*palVar67)[1] = local_21e0._8_8_;
            (*palVar67)[2] = local_21e0._16_8_;
            (*palVar67)[3] = local_21e0._24_8_;
            auVar23 = vpblendvb_avx2((undefined1  [32])alVar31,local_2160,auVar18);
            auVar15 = vpaddsb_avx2(local_2200,
                                   *(undefined1 (*) [32])
                                    (lVar7 + (long)(iVar3 * iVar57) * 0x20 + (long)local_1db0 * 0x20
                                    ));
            auVar15 = vpblendvb_avx2(auVar23,auVar15,auVar17);
            auVar43._16_8_ = uStack_17d0;
            auVar43._0_16_ = auVar11;
            auVar43._24_8_ = uStack_17c8;
            auVar25 = vpblendvb_avx2(auVar15,auVar43,auVar16);
            palVar67 = local_1e20 + local_1db0;
            local_2200._0_8_ = auVar25._0_8_;
            local_2200._8_8_ = auVar25._8_8_;
            local_2200._16_8_ = auVar25._16_8_;
            local_2200._24_8_ = auVar25._24_8_;
            (*palVar67)[0] = local_2200._0_8_;
            (*palVar67)[1] = local_2200._8_8_;
            (*palVar67)[2] = local_2200._16_8_;
            (*palVar67)[3] = local_2200._24_8_;
            auVar23 = vpblendvb_avx2((undefined1  [32])alVar32,local_2180,auVar18);
            auVar21._16_8_ = uStack_1810;
            auVar21._0_16_ = auVar10;
            auVar21._24_8_ = uStack_1808;
            auVar15 = vpaddsb_avx2(local_2220,auVar21);
            auVar15 = vpblendvb_avx2(auVar23,auVar15,auVar17);
            auVar22._16_8_ = uStack_17d0;
            auVar22._0_16_ = auVar11;
            auVar22._24_8_ = uStack_17c8;
            auVar16 = vpblendvb_avx2(auVar15,auVar22,auVar16);
            palVar67 = local_1e30 + local_1db0;
            local_2220._0_8_ = auVar16._0_8_;
            local_2220._8_8_ = auVar16._8_8_;
            local_2220._16_8_ = auVar16._16_8_;
            local_2220._24_8_ = auVar16._24_8_;
            (*palVar67)[0] = local_2220._0_8_;
            (*palVar67)[1] = local_2220._8_8_;
            (*palVar67)[2] = local_2220._16_8_;
            (*palVar67)[3] = local_2220._24_8_;
            auVar15 = vpmaxsb_avx2(local_1fe0,auVar24);
            auVar15 = vpmaxsb_avx2(auVar15,auVar25);
            local_1fe0 = vpmaxsb_avx2(auVar15,auVar16);
            local_1f80 = vpmaxsb_avx2(auVar20,local_1f80);
            auVar50._16_8_ = uStack_1890;
            auVar50._0_16_ = auVar8;
            auVar50._24_8_ = uStack_1888;
            auVar22 = vpsubsb_avx2(auVar20,auVar50);
            auVar49._16_8_ = uStack_1850;
            auVar49._0_16_ = auVar9;
            auVar49._24_8_ = uStack_1848;
            auVar15 = vpsubsb_avx2((undefined1  [32])alVar26,auVar49);
            auVar21 = vpmaxsb_avx2(auVar22,auVar15);
            auVar20 = vpcmpgtb_avx2(auVar22,auVar15);
            auVar17 = vpblendvb_avx2((undefined1  [32])alVar27,auVar24,auVar20);
            auVar18 = vpblendvb_avx2((undefined1  [32])alVar28,auVar25,auVar20);
            auVar36._16_8_ = uStack_1810;
            auVar36._0_16_ = auVar10;
            auVar36._24_8_ = uStack_1808;
            auVar15 = vpaddsb_avx2((undefined1  [32])alVar29,auVar36);
            auVar35._16_8_ = uStack_1810;
            auVar35._0_16_ = auVar10;
            auVar35._24_8_ = uStack_1808;
            auVar23 = vpaddsb_avx2(auVar16,auVar35);
            auVar15 = vpblendvb_avx2(auVar15,auVar23,auVar20);
            palVar67 = ptr + local_1db0;
            local_2060 = auVar21._0_8_;
            lStack_2058 = auVar21._8_8_;
            lStack_2050 = auVar21._16_8_;
            lStack_2048 = auVar21._24_8_;
            (*palVar67)[0] = local_2060;
            (*palVar67)[1] = lStack_2058;
            (*palVar67)[2] = lStack_2050;
            (*palVar67)[3] = lStack_2048;
            palVar67 = ptr_00 + local_1db0;
            local_20a0 = auVar17._0_8_;
            lStack_2098 = auVar17._8_8_;
            lStack_2090 = auVar17._16_8_;
            lStack_2088 = auVar17._24_8_;
            (*palVar67)[0] = local_20a0;
            (*palVar67)[1] = lStack_2098;
            (*palVar67)[2] = lStack_2090;
            (*palVar67)[3] = lStack_2088;
            palVar67 = ptr_01 + local_1db0;
            local_20c0 = auVar18._0_8_;
            lStack_20b8 = auVar18._8_8_;
            lStack_20b0 = auVar18._16_8_;
            lStack_20a8 = auVar18._24_8_;
            (*palVar67)[0] = local_20c0;
            (*palVar67)[1] = lStack_20b8;
            (*palVar67)[2] = lStack_20b0;
            (*palVar67)[3] = lStack_20a8;
            palVar67 = ptr_02 + local_1db0;
            local_20e0 = auVar15._0_8_;
            lStack_20d8 = auVar15._8_8_;
            lStack_20d0 = auVar15._16_8_;
            lStack_20c8 = auVar15._24_8_;
            (*palVar67)[0] = local_20e0;
            (*palVar67)[1] = lStack_20d8;
            (*palVar67)[2] = lStack_20d0;
            (*palVar67)[3] = lStack_20c8;
            auVar20._16_8_ = uStack_1850;
            auVar20._0_16_ = auVar9;
            auVar20._24_8_ = uStack_1848;
            auVar15 = vpsubsb_avx2(local_2100,auVar20);
            local_2100 = vpmaxsb_avx2(auVar22,auVar15);
            auVar17 = vpcmpgtb_avx2(auVar22,auVar15);
            local_2140 = vpblendvb_avx2(local_2140,auVar24,auVar17);
            local_2160 = vpblendvb_avx2(local_2160,auVar25,auVar17);
            auVar25._16_8_ = uStack_1810;
            auVar25._0_16_ = auVar10;
            auVar25._24_8_ = uStack_1808;
            auVar15 = vpaddsb_avx2(local_2180,auVar25);
            auVar24._16_8_ = uStack_1810;
            auVar24._0_16_ = auVar10;
            auVar24._24_8_ = uStack_1808;
            auVar23 = vpaddsb_avx2(auVar16,auVar24);
            local_2180 = vpblendvb_avx2(auVar15,auVar23,auVar17);
            local_21a0 = *(undefined1 (*) [32])(palVar55 + local_1db0);
            local_21e0._0_32_ = *(undefined1 (*) [32])(palVar54 + local_1db0);
            local_2200 = *(undefined1 (*) [32])(palVar53 + local_1db0);
            local_2220 = *(undefined1 (*) [32])(palVar52 + local_1db0);
          }
          for (local_1db8 = 0; local_1db8 < 0x20; local_1db8 = local_1db8 + 1) {
            auVar23 = vperm2i128_avx2(auVar23,(undefined1  [32])palVar55[iVar57 + -1],0x28);
            auVar15 = vpalignr_avx2((undefined1  [32])palVar55[iVar57 + -1],auVar23,0xf);
            auVar24 = vperm2i128_avx2(auVar23,local_2100,0x28);
            auVar23 = vpalignr_avx2(local_2100,auVar24,0xf);
            auVar25 = vperm2i128_avx2(auVar24,local_2140,0x28);
            auVar24 = vpalignr_avx2(local_2140,auVar25,0xf);
            auVar16 = vperm2i128_avx2(auVar25,local_2160,0x28);
            auVar25 = vpalignr_avx2(local_2160,auVar16,0xf);
            auVar16 = vperm2i128_avx2(auVar16,local_2180,0x28);
            auVar16 = vpalignr_avx2(local_2180,auVar16,0xf);
            auVar42._16_8_ = uStack_17d0;
            auVar42._0_16_ = auVar11;
            auVar42._24_8_ = uStack_17c8;
            local_2300 = (__m256i)vpblendvb_avx2(auVar15,auVar42,auVar19);
            auVar41._16_8_ = uStack_17d0;
            auVar41._0_16_ = auVar11;
            auVar41._24_8_ = uStack_17c8;
            local_2100 = vpblendvb_avx2(auVar23,auVar41,auVar19);
            auVar40._16_8_ = uStack_17d0;
            auVar40._0_16_ = auVar11;
            auVar40._24_8_ = uStack_17c8;
            local_2140 = vpblendvb_avx2(auVar24,auVar40,auVar19);
            auVar39._16_8_ = uStack_17d0;
            auVar39._0_16_ = auVar11;
            auVar39._24_8_ = uStack_17c8;
            local_2160 = vpblendvb_avx2(auVar25,auVar39,auVar19);
            local_2180 = vpblendvb_avx2(auVar16,auVar14,auVar19);
            auVar23 = auVar14;
            for (local_1db0 = 0; local_1db0 < iVar57; local_1db0 = local_1db0 + 1) {
              auVar15 = vpaddsb_avx2((undefined1  [32])local_2300,
                                     *(undefined1 (*) [32])(lVar58 + (long)local_1db0 * 0x20));
              auVar17 = vpmaxsb_avx2((undefined1  [32])local_1e00[local_1db0],local_2100);
              palVar67 = local_1e00 + local_1db0;
              local_21a0._0_8_ = auVar17._0_8_;
              local_21a0._8_8_ = auVar17._8_8_;
              local_21a0._16_8_ = auVar17._16_8_;
              local_21a0._24_8_ = auVar17._24_8_;
              (*palVar67)[0] = local_21a0._0_8_;
              (*palVar67)[1] = local_21a0._8_8_;
              (*palVar67)[2] = local_21a0._16_8_;
              (*palVar67)[3] = local_21a0._24_8_;
              auVar15 = vpcmpeqb_avx2(auVar17,auVar15);
              auVar23 = vpcmpeqb_avx2(auVar17,local_2100);
              auVar15 = vpandn_avx2(auVar15,auVar23);
              auVar24 = vpblendvb_avx2((undefined1  [32])local_1e10[local_1db0],local_2140,auVar15);
              palVar67 = local_1e10 + local_1db0;
              local_21e0._0_8_ = auVar24._0_8_;
              local_21e0._8_8_ = auVar24._8_8_;
              local_21e0._16_8_ = auVar24._16_8_;
              local_21e0._24_8_ = auVar24._24_8_;
              (*palVar67)[0] = local_21e0._0_8_;
              (*palVar67)[1] = local_21e0._8_8_;
              (*palVar67)[2] = local_21e0._16_8_;
              (*palVar67)[3] = local_21e0._24_8_;
              auVar25 = vpblendvb_avx2((undefined1  [32])local_1e20[local_1db0],local_2160,auVar15);
              palVar67 = local_1e20 + local_1db0;
              local_2200._0_8_ = auVar25._0_8_;
              local_2200._8_8_ = auVar25._8_8_;
              local_2200._16_8_ = auVar25._16_8_;
              local_2200._24_8_ = auVar25._24_8_;
              (*palVar67)[0] = local_2200._0_8_;
              (*palVar67)[1] = local_2200._8_8_;
              (*palVar67)[2] = local_2200._16_8_;
              (*palVar67)[3] = local_2200._24_8_;
              auVar16 = vpblendvb_avx2((undefined1  [32])local_1e30[local_1db0],local_2180,auVar15);
              palVar67 = local_1e30 + local_1db0;
              local_2220._0_8_ = auVar16._0_8_;
              local_2220._8_8_ = auVar16._8_8_;
              local_2220._16_8_ = auVar16._16_8_;
              local_2220._24_8_ = auVar16._24_8_;
              (*palVar67)[0] = local_2220._0_8_;
              (*palVar67)[1] = local_2220._8_8_;
              (*palVar67)[2] = local_2220._16_8_;
              (*palVar67)[3] = local_2220._24_8_;
              auVar15 = vpmaxsb_avx2(local_1fe0,auVar24);
              auVar15 = vpmaxsb_avx2(auVar15,auVar25);
              local_1fe0 = vpmaxsb_avx2(auVar15,auVar16);
              local_1f80 = vpmaxsb_avx2(auVar17,local_1f80);
              auVar48._16_8_ = uStack_1890;
              auVar48._0_16_ = auVar8;
              auVar48._24_8_ = uStack_1888;
              auVar18 = vpsubsb_avx2(auVar17,auVar48);
              auVar47._16_8_ = uStack_1850;
              auVar47._0_16_ = auVar9;
              auVar47._24_8_ = uStack_1848;
              local_2100 = vpsubsb_avx2(local_2100,auVar47);
              auVar23 = vpcmpgtb_avx2(local_2100,auVar18);
              auVar15 = vpcmpeqb_avx2(local_2100,auVar18);
              auVar38._16_8_ = uStack_17d0;
              auVar38._0_16_ = auVar11;
              auVar38._24_8_ = uStack_17c8;
              auVar17 = vpcmpgtb_avx2(local_2100,auVar38);
              auVar15 = vpand_avx2(auVar15,auVar17);
              auVar15 = vpor_avx2(auVar23,auVar15);
              if ((((((((((((((((((((((((((((((((auVar15 >> 7 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0 &&
                                               (auVar15 >> 0xf & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar15 >> 0x17 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar15 >> 0x1f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar15 >> 0x27 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar15 >> 0x2f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar15 >> 0x37 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         (auVar15 >> 0x3f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar15 >> 0x47 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                       (auVar15 >> 0x4f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar15 >> 0x57 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar15 >> 0x5f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar15 >> 0x67 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar15 >> 0x6f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar15 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && SUB321(auVar15 >> 0x7f,0) == '\0') &&
                                (auVar15 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar15 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar15 >> 0x97 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                             (auVar15 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar15 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar15 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar15 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar15 >> 0xbf,0) == '\0') &&
                        (auVar15 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar15 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar15 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar15 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar15 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (auVar15 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar15 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  -1 < auVar15[0x1f]) goto LAB_00ee4ea0;
              auVar17 = vpcmpgtb_avx2(auVar18,local_2100);
              local_2140 = vpblendvb_avx2(local_2140,auVar24,auVar17);
              local_2160 = vpblendvb_avx2(local_2160,auVar25,auVar17);
              auVar34._16_8_ = uStack_1810;
              auVar34._0_16_ = auVar10;
              auVar34._24_8_ = uStack_1808;
              auVar15 = vpaddsb_avx2(local_2180,auVar34);
              auVar33._16_8_ = uStack_1810;
              auVar33._0_16_ = auVar10;
              auVar33._24_8_ = uStack_1808;
              auVar23 = vpaddsb_avx2(auVar16,auVar33);
              local_2180 = vpblendvb_avx2(auVar15,auVar23,auVar17);
              local_2300 = palVar55[local_1db0];
            }
          }
LAB_00ee4ea0:
          local_21a0 = *(undefined1 (*) [32])(local_1e00 + iVar59);
          local_21e0._0_32_ = *(undefined1 (*) [32])(local_1e10 + iVar59);
          local_2200 = *(undefined1 (*) [32])(local_1e20 + iVar59);
          local_2220 = *(undefined1 (*) [32])(local_1e30 + iVar59);
          for (local_1db8 = 0; local_1db8 < (int)(~((local_1dbc + -1) / iVar57) + 0x20U);
              local_1db8 = local_1db8 + 1) {
            auVar15 = vperm2i128_avx2(auVar23,local_21a0,0x28);
            local_21a0 = vpalignr_avx2(local_21a0,auVar15,0xf);
            auVar15 = vperm2i128_avx2(auVar15,local_21e0._0_32_,0x28);
            local_21e0._0_32_ = vpalignr_avx2(local_21e0._0_32_,auVar15,0xf);
            auVar15 = vperm2i128_avx2(auVar15,local_2200,0x28);
            local_2200 = vpalignr_avx2(local_2200,auVar15,0xf);
            auVar23 = vperm2i128_avx2(auVar15,local_2220,0x28);
            local_2220 = vpalignr_avx2(local_2220,auVar23,0xf);
          }
          *(int *)(*((local_1d90->field_4).trace)->trace_del_table + (long)local_1db4 * 4) =
               local_21a0[0x1f] + 0x80;
          *(int *)(*(long *)((long)((local_1d90->field_4).trace)->trace_del_table + 8) +
                  (long)local_1db4 * 4) = local_21e0[0x1f] + 0x80;
          *(int *)(*(long *)((long)((local_1d90->field_4).trace)->trace_del_table + 0x10) +
                  (long)local_1db4 * 4) = local_2200[0x1f] + 0x80;
          *(int *)(*(long *)((long)((local_1d90->field_4).trace)->trace_del_table + 0x18) +
                  (long)local_1db4 * 4) = local_2220[0x1f] + 0x80;
          auVar37._16_8_ = uStack_1f90;
          auVar37._0_16_ = auVar60;
          auVar37._24_8_ = uStack_1f88;
          auVar63 = ZEXT3264(auVar37);
          auVar15 = vpcmpgtb_avx2(local_1f80,auVar37);
          lStack_2368 = auVar15._24_8_;
          bVar56 = in_stack_ffffffffffffdb92;
          if ((((((((((((((((((((((((((((((((auVar15 >> 7 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0 ||
                                           (auVar15 >> 0xf & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar15 >> 0x17 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar15 >> 0x1f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar15 >> 0x27 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar15 >> 0x2f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar15 >> 0x37 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar15 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar15 >> 0x47 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar15 >> 0x4f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar15 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar15 >> 0x5f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar15 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar15 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar15 >> 0x77 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar15 >> 0x7f,0) != '\0') ||
                            (auVar15 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar15 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar15 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar15 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar15 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar15 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar15 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar15 >> 0xbf,0) != '\0') ||
                    (auVar15 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar15 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar15 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar15 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar15 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar15 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar15 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) || lStack_2368 < 0
             ) {
            a._8_12_ = in_stack_ffffffffffffdb80;
            a[0] = 0xee5159;
            a[2]._4_4_ = in_stack_ffffffffffffdb8c;
            a[3]._0_2_ = in_stack_ffffffffffffdb90;
            a[3]._2_1_ = in_stack_ffffffffffffdb92;
            a[3]._3_1_ = local_1da8;
            a[3]._4_1_ = local_1dac;
            a[3]._5_1_ = uVar64;
            a[3]._6_1_ = uVar65;
            a[3]._7_1_ = uVar66;
            bVar56 = _mm256_hmax_epi8_rpl(a);
            local_1f02 = bVar56;
            if ((char)('\x7f' - ((char)uVar1 + '\x01')) < (char)bVar56) {
              local_1d90->flag = local_1d90->flag | 0x40;
              break;
            }
            auVar62 = vpinsrb_avx(ZEXT116(bVar56),(uint)bVar56,1);
            auVar62 = vpinsrb_avx(auVar62,(uint)bVar56,2);
            auVar62 = vpinsrb_avx(auVar62,(uint)bVar56,3);
            auVar62 = vpinsrb_avx(auVar62,(uint)bVar56,4);
            auVar62 = vpinsrb_avx(auVar62,(uint)bVar56,5);
            auVar62 = vpinsrb_avx(auVar62,(uint)bVar56,6);
            auVar62 = vpinsrb_avx(auVar62,(uint)bVar56,7);
            auVar62 = vpinsrb_avx(auVar62,(uint)bVar56,8);
            auVar62 = vpinsrb_avx(auVar62,(uint)bVar56,9);
            auVar62 = vpinsrb_avx(auVar62,(uint)bVar56,10);
            auVar62 = vpinsrb_avx(auVar62,(uint)bVar56,0xb);
            auVar62 = vpinsrb_avx(auVar62,(uint)bVar56,0xc);
            auVar62 = vpinsrb_avx(auVar62,(uint)bVar56,0xd);
            auVar62 = vpinsrb_avx(auVar62,(uint)bVar56,0xe);
            auVar62 = vpinsrb_avx(auVar62,(uint)bVar56,0xf);
            auVar63 = ZEXT1664(auVar62);
            auVar60 = vpinsrb_avx(ZEXT116(bVar56),(uint)bVar56,1);
            auVar60 = vpinsrb_avx(auVar60,(uint)bVar56,2);
            auVar60 = vpinsrb_avx(auVar60,(uint)bVar56,3);
            auVar60 = vpinsrb_avx(auVar60,(uint)bVar56,4);
            auVar60 = vpinsrb_avx(auVar60,(uint)bVar56,5);
            auVar60 = vpinsrb_avx(auVar60,(uint)bVar56,6);
            auVar60 = vpinsrb_avx(auVar60,(uint)bVar56,7);
            auVar60 = vpinsrb_avx(auVar60,(uint)bVar56,8);
            auVar60 = vpinsrb_avx(auVar60,(uint)bVar56,9);
            auVar60 = vpinsrb_avx(auVar60,(uint)bVar56,10);
            auVar60 = vpinsrb_avx(auVar60,(uint)bVar56,0xb);
            auVar60 = vpinsrb_avx(auVar60,(uint)bVar56,0xc);
            auVar60 = vpinsrb_avx(auVar60,(uint)bVar56,0xd);
            auVar60 = vpinsrb_avx(auVar60,(uint)bVar56,0xe);
            auVar60 = vpinsrb_avx(auVar60,(uint)bVar56,0xf);
            auVar60 = ZEXT116(0) * auVar62 + ZEXT116(1) * auVar60;
            auVar62 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar62;
            local_1dc0 = local_1db4;
          }
          local_1db4 = local_1db4 + 1;
          in_stack_ffffffffffffdb92 = bVar56;
        }
        palVar51 = local_1e60;
        palVar69 = local_1e68;
        palVar68 = local_1e70;
        palVar67 = local_1e78;
        local_1db0 = 0;
        while( true ) {
          uStack_1fe8 = auVar61._8_8_;
          uStack_1ff0 = auVar61._0_8_;
          if (iVar57 <= local_1db0) break;
          vH_00[0]._4_4_ = in_stack_ffffffffffffdb9c;
          vH_00[0]._0_4_ = in_stack_ffffffffffffdb98;
          vH_00[1] = in_stack_ffffffffffffdba0;
          vH_00[2] = in_stack_ffffffffffffdba8;
          vH_00[3] = in_stack_ffffffffffffdbb0;
          arr_store_col(in_stack_ffffffffffffdbc0,vH_00,
                        CONCAT13(uVar66,CONCAT12(uVar65,CONCAT11(uVar64,local_1dac))),
                        CONCAT13(local_1da8,
                                 CONCAT12(in_stack_ffffffffffffdb92,in_stack_ffffffffffffdb90)),
                        in_stack_ffffffffffffdb8c);
          vH_01[0]._4_4_ = in_stack_ffffffffffffdb9c;
          vH_01[0]._0_4_ = in_stack_ffffffffffffdb98;
          vH_01[1] = in_stack_ffffffffffffdba0;
          vH_01[2] = in_stack_ffffffffffffdba8;
          vH_01[3] = in_stack_ffffffffffffdbb0;
          arr_store_col(in_stack_ffffffffffffdbc0,vH_01,
                        CONCAT13(uVar66,CONCAT12(uVar65,CONCAT11(uVar64,local_1dac))),
                        CONCAT13(local_1da8,
                                 CONCAT12(in_stack_ffffffffffffdb92,in_stack_ffffffffffffdb90)),
                        in_stack_ffffffffffffdb8c);
          vH_02[0]._4_4_ = in_stack_ffffffffffffdb9c;
          vH_02[0]._0_4_ = in_stack_ffffffffffffdb98;
          vH_02[1] = in_stack_ffffffffffffdba0;
          vH_02[2] = in_stack_ffffffffffffdba8;
          vH_02[3] = in_stack_ffffffffffffdbb0;
          arr_store_col(in_stack_ffffffffffffdbc0,vH_02,
                        CONCAT13(uVar66,CONCAT12(uVar65,CONCAT11(uVar64,local_1dac))),
                        CONCAT13(local_1da8,
                                 CONCAT12(in_stack_ffffffffffffdb92,in_stack_ffffffffffffdb90)),
                        in_stack_ffffffffffffdb8c);
          vH_03[0]._4_4_ = in_stack_ffffffffffffdb9c;
          vH_03[0]._0_4_ = in_stack_ffffffffffffdb98;
          vH_03[1] = in_stack_ffffffffffffdba0;
          vH_03[2] = in_stack_ffffffffffffdba8;
          vH_03[3] = in_stack_ffffffffffffdbb0;
          arr_store_col(in_stack_ffffffffffffdbc0,vH_03,
                        CONCAT13(uVar66,CONCAT12(uVar65,CONCAT11(uVar64,local_1dac))),
                        CONCAT13(local_1da8,
                                 CONCAT12(in_stack_ffffffffffffdb92,in_stack_ffffffffffffdb90)),
                        in_stack_ffffffffffffdb8c);
          local_1db0 = local_1db0 + 1;
        }
        if ((local_1f02 == 0x7f) ||
           (auVar45._16_8_ = uStack_1ff0,
           auVar45._0_16_ = ZEXT116(0) * auVar12 + ZEXT116(1) * auVar13,
           auVar45._24_8_ = uStack_1fe8, auVar14 = vpcmpeqb_avx2(local_1fe0,auVar45),
           (((((((((((((((((((((((((((((((auVar14 >> 7 & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0 ||
                                        (auVar14 >> 0xf & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar14 >> 0x17 & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar14 >> 0x1f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar14 >> 0x27 & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar14 >> 0x2f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar14 >> 0x37 & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar14 >> 0x47 & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar14 >> 0x4f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar14 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar14 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar14 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar14 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar14 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          SUB321(auVar14 >> 0x7f,0) != '\0') ||
                         (auVar14 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar14 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar14 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar14 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar14 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar14 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar14 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  SUB321(auVar14 >> 0xbf,0) != '\0') ||
                 (auVar14 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar14 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar14 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar14 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (auVar14 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar14 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           (auVar14 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           auVar14[0x1f] < '\0')) {
          local_1d90->flag = local_1d90->flag | 0x40;
        }
        iVar59 = parasail_result_is_saturated(local_1d90);
        if (iVar59 == 0) {
          if (local_1dc0 == local_1db4 + -1) {
            local_1e60 = local_1e00;
            local_1e00 = palVar51;
            local_1e68 = local_1e10;
            local_1e10 = palVar69;
            local_1e70 = local_1e20;
            local_1e20 = palVar68;
            local_1e78 = local_1e30;
            local_1e30 = palVar67;
          }
          else if (local_1dc0 == local_1db4 + -2) {
            local_1e60 = local_1e08;
            local_1e08 = palVar51;
            local_1e68 = local_1e18;
            local_1e18 = palVar69;
            local_1e70 = local_1e28;
            local_1e28 = palVar68;
            local_1e78 = local_1e38;
            local_1e38 = palVar67;
          }
          local_2448 = local_1e60;
          palVar67 = local_1e78;
          palVar68 = local_1e70;
          palVar69 = local_1e68;
          for (local_1db0 = 0; local_1db0 < iVar57 * 0x20; local_1db0 = local_1db0 + 1) {
            if (((byte)(*local_2448)[0] == local_1f02) &&
               (iVar59 = local_1db0 / 0x20 + (local_1db0 % 0x20) * iVar57, iVar59 < local_1dbc)) {
              local_1f03 = (char)(*palVar69)[0];
              local_1f04 = (char)(*palVar68)[0];
              local_1f05 = (char)(*palVar67)[0];
              local_1dbc = iVar59;
            }
            local_2448 = (__m256i *)((long)*local_2448 + 1);
            palVar69 = (__m256i *)((long)*palVar69 + 1);
            palVar68 = (__m256i *)((long)*palVar68 + 1);
            palVar67 = (__m256i *)((long)*palVar67 + 1);
          }
        }
        else {
          local_1f02 = 0;
          local_1dbc = 0;
          local_1dc0 = 0;
          local_1f03 = '\0';
          local_1f04 = '\0';
          local_1f05 = '\0';
        }
        local_1d90->score = (char)local_1f02 + 0x80;
        local_1d90->end_query = local_1dbc;
        local_1d90->end_ref = local_1dc0;
        ((local_1d90->field_4).stats)->matches = local_1f03 + 0x80;
        ((local_1d90->field_4).stats)->similar = local_1f04 + 0x80;
        ((local_1d90->field_4).stats)->length = local_1f05 + 0x80;
        parasail_free(local_1e78);
        parasail_free(local_1e70);
        parasail_free(local_1e68);
        parasail_free(local_1e60);
        parasail_free(ptr_02);
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        parasail_free(local_1e38);
        parasail_free(local_1e30);
        parasail_free(local_1e28);
        parasail_free(local_1e20);
        parasail_free(local_1e18);
        parasail_free(local_1e10);
        parasail_free(local_1e08);
        parasail_free(local_1e00);
      }
    }
  }
  return local_1d90;
}

Assistant:

STATIC parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict vProfile = NULL;
    __m256i* restrict vProfileM = NULL;
    __m256i* restrict vProfileS = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvHMStore = NULL;
    __m256i* restrict pvHMLoad = NULL;
    __m256i* restrict pvHSStore = NULL;
    __m256i* restrict pvHSLoad = NULL;
    __m256i* restrict pvHLStore = NULL;
    __m256i* restrict pvHLLoad = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEM = NULL;
    __m256i* restrict pvES = NULL;
    __m256i* restrict pvEL = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvHMMax = NULL;
    __m256i* restrict pvHSMax = NULL;
    __m256i* restrict pvHLMax = NULL;
    __m256i vGapO;
    __m256i vGapE;
    __m256i vZero;
    __m256i vOne;
    int8_t bias = 0;
    int8_t score = 0;
    int8_t matches = 0;
    int8_t similar = 0;
    int8_t length = 0;
    __m256i vBias;
    __m256i vBias1;
    __m256i vMaxH;
    __m256i vMaxHUnit;
    __m256i insert_mask;
    __m256i vSaturationCheckMax;
    __m256i vPosLimit;
    int8_t maxp = 0;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 32; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile  = (__m256i*)profile->profile8.score;
    vProfileM = (__m256i*)profile->profile8.matches;
    vProfileS = (__m256i*)profile->profile8.similar;
    vGapO = _mm256_set1_epi8(open);
    vGapE = _mm256_set1_epi8(gap);
    vZero = _mm256_setzero_si256();
    vOne = _mm256_set1_epi8(1);
    bias = INT8_MIN;
    score = bias;
    matches = bias;
    similar = bias;
    length = bias;
    vBias = _mm256_set1_epi8(bias);
    vBias1 = _mm256_adds_epi8(vBias,vOne);
    vMaxH = vBias;
    vMaxHUnit = vBias;
    insert_mask = _mm256_cmpgt_epi8(
            _mm256_set_epi8(0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,1),
            vZero);
    vSaturationCheckMax = vBias;
    vPosLimit = _mm256_set1_epi8(INT8_MAX);
    maxp = INT8_MAX - (int8_t)(matrix->max+1);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_32;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m256i(32, segLen);
    pvHLoad   = parasail_memalign___m256i(32, segLen);
    pvHMStore = parasail_memalign___m256i(32, segLen);
    pvHMLoad  = parasail_memalign___m256i(32, segLen);
    pvHSStore = parasail_memalign___m256i(32, segLen);
    pvHSLoad  = parasail_memalign___m256i(32, segLen);
    pvHLStore = parasail_memalign___m256i(32, segLen);
    pvHLLoad  = parasail_memalign___m256i(32, segLen);
    pvE       = parasail_memalign___m256i(32, segLen);
    pvEM      = parasail_memalign___m256i(32, segLen);
    pvES      = parasail_memalign___m256i(32, segLen);
    pvEL      = parasail_memalign___m256i(32, segLen);
    pvHMax    = parasail_memalign___m256i(32, segLen);
    pvHMMax   = parasail_memalign___m256i(32, segLen);
    pvHSMax   = parasail_memalign___m256i(32, segLen);
    pvHLMax   = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;

    parasail_memset___m256i(pvHStore, vBias, segLen);
    parasail_memset___m256i(pvHMStore, vBias, segLen);
    parasail_memset___m256i(pvHSStore, vBias, segLen);
    parasail_memset___m256i(pvHLStore, vBias, segLen);
    parasail_memset___m256i(pvE, vBias, segLen);
    parasail_memset___m256i(pvEM, vBias, segLen);
    parasail_memset___m256i(pvES, vBias, segLen);
    parasail_memset___m256i(pvEL, vBias1, segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vEF_opn;
        __m256i vE;
        __m256i vE_ext;
        __m256i vEM;
        __m256i vES;
        __m256i vEL;
        __m256i vF;
        __m256i vF_ext;
        __m256i vFM;
        __m256i vFS;
        __m256i vFL;
        __m256i vH;
        __m256i vH_dag;
        __m256i vHM;
        __m256i vHS;
        __m256i vHL;
        const __m256i* vP = NULL;
        const __m256i* vPM = NULL;
        const __m256i* vPS = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = vBias;
        vFM = vBias;
        vFS = vBias;
        vFL = vBias1;

        /* load final segment of pvHStore and shift left by 1 bytes */
        vH = _mm256_load_si256(&pvHStore[segLen - 1]);
        vHM = _mm256_load_si256(&pvHMStore[segLen - 1]);
        vHS = _mm256_load_si256(&pvHSStore[segLen - 1]);
        vHL = _mm256_load_si256(&pvHLStore[segLen - 1]);
        vH = _mm256_slli_si256_rpl(vH, 1);
        vHM = _mm256_slli_si256_rpl(vHM, 1);
        vHS = _mm256_slli_si256_rpl(vHS, 1);
        vHL = _mm256_slli_si256_rpl(vHL, 1);
        vH = _mm256_blendv_epi8(vH, vBias, insert_mask);
        vHM = _mm256_blendv_epi8(vHM, vBias, insert_mask);
        vHS = _mm256_blendv_epi8(vHS, vBias, insert_mask);
        vHL = _mm256_blendv_epi8(vHL, vBias, insert_mask);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            SWAP3(pvHMax,  pvHLoad,  pvHStore)
            SWAP3(pvHMMax, pvHMLoad, pvHMStore)
            SWAP3(pvHSMax, pvHSLoad, pvHSStore)
            SWAP3(pvHLMax, pvHLLoad, pvHLStore)
        }
        else {
            /* Swap the 2 H buffers. */
            SWAP(pvHLoad,  pvHStore)
            SWAP(pvHMLoad, pvHMStore)
            SWAP(pvHSLoad, pvHSStore)
            SWAP(pvHLLoad, pvHLStore)
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m256i cond_zero;
            __m256i case1;
            __m256i case2;

            vE = _mm256_load_si256(pvE+ i);
            vEM = _mm256_load_si256(pvEM+ i);
            vES = _mm256_load_si256(pvES+ i);
            vEL = _mm256_load_si256(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm256_adds_epi8(vH, _mm256_load_si256(vP + i));
            /*vH = _mm256_max_epi8(vH_dag, vBias);*/
            vH = _mm256_max_epi8(vH_dag, vE);
            vH = _mm256_max_epi8(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
            cond_zero = _mm256_cmpeq_epi8(vH, vBias);

            case1 = _mm256_cmpeq_epi8(vH, vH_dag);
            case2 = _mm256_cmpeq_epi8(vH, vF);

            /* calculate vM */
            vHM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    _mm256_adds_epi8(vHM, _mm256_load_si256(vPM + i)), case1);
            vHM = _mm256_blendv_epi8(vHM, vBias, cond_zero);
            _mm256_store_si256(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    _mm256_adds_epi8(vHS, _mm256_load_si256(vPS + i)), case1);
            vHS = _mm256_blendv_epi8(vHS, vBias, cond_zero);
            _mm256_store_si256(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    _mm256_adds_epi8(vHL, vOne), case1);
            vHL = _mm256_blendv_epi8(vHL, vBias, cond_zero);
            _mm256_store_si256(pvHLStore + i, vHL);

            vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len, bias);
            arr_store(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len, bias);
            arr_store(result->stats->tables->length_table, vHL, i, segLen, j, s2Len, bias);
            arr_store(result->stats->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
            vMaxH = _mm256_max_epi8(vH, vMaxH);
            vEF_opn = _mm256_subs_epi8(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm256_subs_epi8(vE, vGapE);
            vE = _mm256_max_epi8(vEF_opn, vE_ext);
            case1 = _mm256_cmpgt_epi8(vEF_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vHM, case1);
            vES = _mm256_blendv_epi8(vES, vHS, case1);
            vEL = _mm256_blendv_epi8(
                    _mm256_adds_epi8(vEL, vOne),
                    _mm256_adds_epi8(vHL, vOne),
                    case1);
            _mm256_store_si256(pvE + i, vE);
            _mm256_store_si256(pvEM + i, vEM);
            _mm256_store_si256(pvES + i, vES);
            _mm256_store_si256(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm256_subs_epi8(vF, vGapE);
            vF = _mm256_max_epi8(vEF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi8(vEF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vHM, case1);
            vFS = _mm256_blendv_epi8(vFS, vHS, case1);
            vFL = _mm256_blendv_epi8(
                    _mm256_adds_epi8(vFL, vOne),
                    _mm256_adds_epi8(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
            vHM = _mm256_load_si256(pvHMLoad + i);
            vHS = _mm256_load_si256(pvHSLoad + i);
            vHL = _mm256_load_si256(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m256i vHp = _mm256_load_si256(&pvHLoad[segLen - 1]);
            vHp = _mm256_slli_si256_rpl(vHp, 1);
            vF = _mm256_slli_si256_rpl(vF, 1);
            vFM = _mm256_slli_si256_rpl(vFM, 1);
            vFS = _mm256_slli_si256_rpl(vFS, 1);
            vFL = _mm256_slli_si256_rpl(vFL, 1);
            vHp = _mm256_blendv_epi8(vHp, vBias, insert_mask);
            vF = _mm256_blendv_epi8(vF, vBias, insert_mask);
            vFM = _mm256_blendv_epi8(vFM, vBias, insert_mask);
            vFS = _mm256_blendv_epi8(vFS, vBias, insert_mask);
            vFL = _mm256_blendv_epi8(vFL, vBias1, insert_mask);
            for (i=0; i<segLen; ++i) {
                __m256i case1;
                __m256i case2;
                __m256i cond;

                vHp = _mm256_adds_epi8(vHp, _mm256_load_si256(vP + i));
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi8(vH, vF);
                _mm256_store_si256(pvHStore + i, vH);
                case1 = _mm256_cmpeq_epi8(vH, vHp);
                case2 = _mm256_cmpeq_epi8(vH, vF);
                cond = _mm256_andnot_si256(case1, case2);

                /* calculate vM */
                vHM = _mm256_load_si256(pvHMStore + i);
                vHM = _mm256_blendv_epi8(vHM, vFM, cond);
                _mm256_store_si256(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm256_load_si256(pvHSStore + i);
                vHS = _mm256_blendv_epi8(vHS, vFS, cond);
                _mm256_store_si256(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm256_load_si256(pvHLStore + i);
                vHL = _mm256_blendv_epi8(vHL, vFL, cond);
                _mm256_store_si256(pvHLStore + i, vHL);

                vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len, bias);
                arr_store(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len, bias);
                arr_store(result->stats->tables->length_table, vHL, i, segLen, j, s2Len, bias);
                arr_store(result->stats->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
                vMaxH = _mm256_max_epi8(vH, vMaxH);
                /* Update vF value. */
                vEF_opn = _mm256_subs_epi8(vH, vGapO);
                vF_ext = _mm256_subs_epi8(vF, vGapE);
                if (! _mm256_movemask_epi8(
                            _mm256_or_si256(
                                _mm256_cmpgt_epi8(vF_ext, vEF_opn),
                                _mm256_and_si256(
                                    _mm256_cmpeq_epi8(vF_ext, vEF_opn),
                                    _mm256_cmpgt_epi8(vF_ext, vBias)))))
                    goto end;
                /*vF = _mm256_max_epi8(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm256_cmpgt_epi8(vEF_opn, vF_ext);
                vFM = _mm256_blendv_epi8(vFM, vHM, cond);
                vFS = _mm256_blendv_epi8(vFS, vHS, cond);
                vFL = _mm256_blendv_epi8(
                        _mm256_adds_epi8(vFL, vOne),
                        _mm256_adds_epi8(vHL, vOne),
                        cond);
                vHp = _mm256_load_si256(pvHLoad + i);
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            vHM = _mm256_load_si256(pvHMStore + offset);
            vHS = _mm256_load_si256(pvHSStore + offset);
            vHL = _mm256_load_si256(pvHLStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 1);
                vHM = _mm256_slli_si256_rpl(vHM, 1);
                vHS = _mm256_slli_si256_rpl(vHS, 1);
                vHL = _mm256_slli_si256_rpl(vHL, 1);
            }
            result->stats->rowcols->score_row[j] = (int8_t) _mm256_extract_epi8_rpl (vH, 31) - bias;
            result->stats->rowcols->matches_row[j] = (int8_t) _mm256_extract_epi8_rpl (vHM, 31) - bias;
            result->stats->rowcols->similar_row[j] = (int8_t) _mm256_extract_epi8_rpl (vHS, 31) - bias;
            result->stats->rowcols->length_row[j] = (int8_t) _mm256_extract_epi8_rpl (vHL, 31) - bias;
        }
#endif

        {
            __m256i vCompare = _mm256_cmpgt_epi8(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi8_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm256_set1_epi8(score);
                end_ref = j;
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        __m256i vHM = _mm256_load_si256(pvHMStore+i);
        __m256i vHS = _mm256_load_si256(pvHSStore+i);
        __m256i vHL = _mm256_load_si256(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen, bias);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen, bias);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen, bias);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen, bias);
    }
#endif

    if (score == INT8_MAX
            || _mm256_movemask_epi8(_mm256_cmpeq_epi8(vSaturationCheckMax,vPosLimit))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = 0;
        end_query = 0;
        end_ref = 0;
        matches = 0;
        similar = 0;
        length = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            SWAP(pvHMax,  pvHStore)
            SWAP(pvHMMax, pvHMStore)
            SWAP(pvHSMax, pvHSStore)
            SWAP(pvHLMax, pvHLStore)
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            SWAP(pvHMax,  pvHLoad)
            SWAP(pvHMMax, pvHMLoad)
            SWAP(pvHSMax, pvHSLoad)
            SWAP(pvHLMax, pvHLLoad)
        }
        /* Trace the alignment ending position on read. */
        {
            int8_t *t = (int8_t*)pvHMax;
            int8_t *m = (int8_t*)pvHMMax;
            int8_t *s = (int8_t*)pvHSMax;
            int8_t *l = (int8_t*)pvHLMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len;
            for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                        matches = *m;
                        similar = *s;
                        length = *l;
                    }
                }
            }
        }
    }

    result->score = score - bias;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches - bias;
    result->stats->similar = similar - bias;
    result->stats->length = length - bias;

    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}